

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

bool matches_objectName_non_null(QObject *obj,QAnyStringView name)

{
  _func_int **pp_Var1;
  bool bVar2;
  byte bVar3;
  QAnyStringView lhs;
  QObjectData *pQVar4;
  
  pQVar4 = (obj->d_ptr).d;
  pp_Var1 = pQVar4[1]._vptr_QObjectData;
  if (pp_Var1 != (_func_int **)0x0) {
    lhs.m_size = (ulong)pp_Var1[0xe] | 0x8000000000000000;
    lhs.field_0.m_data = ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(pp_Var1 + 0xd))->m_data;
    bVar2 = QAnyStringView::equal(lhs,name);
    pQVar4 = (QObjectData *)(ulong)bVar2;
  }
  bVar3 = (byte)pQVar4;
  if (pp_Var1 == (_func_int **)0x0) {
    bVar3 = ((undefined1  [16])name & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0
    ;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

static bool matches_objectName_non_null(QObject *obj, QAnyStringView name)
{
    if (auto ext = QObjectPrivate::get(obj)->extraData)
        return ext ->objectName.valueBypassingBindings() == name;
    return name.isEmpty();
}